

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::CoordSysTransform(ParsedScene *this,string *name,FileLoc loc)

{
  bool bVar1;
  mapped_type *__src;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  key_type *in_stack_00000008;
  FileLoc *in_stack_00000010;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [3];
  
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[18]>
              (in_stack_00000010,(char *)in_stack_00000008,(char (*) [18])unaff_retaddr);
  }
  else {
    local_18[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0x9cb200);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (bVar1) {
      __src = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                            *)in_stack_00000010,in_stack_00000008);
      memcpy((void *)(in_RDI + 0x864),__src,0x100);
    }
    else {
      Warning<std::__cxx11::string_const&>
                (in_stack_00000010,(char *)in_stack_00000008,unaff_retaddr);
    }
  }
  return;
}

Assistant:

void ParsedScene::CoordSysTransform(const std::string &name, FileLoc loc) {
    VERIFY_INITIALIZED("CoordSysTransform");
    if (namedCoordinateSystems.find(name) != namedCoordinateSystems.end())
        curTransform = namedCoordinateSystems[name];
    else
        Warning(&loc, "Couldn't find named coordinate system \"%s\"", name);
}